

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O0

FunctionCodeGenJitTimeData * __thiscall
Js::FunctionCodeGenJitTimeData::GetInlinee
          (FunctionCodeGenJitTimeData *this,ProfileId profiledCallSiteId)

{
  code *pcVar1;
  ProfileId PVar2;
  bool bVar3;
  ProfileId PVar4;
  FunctionBody *pFVar5;
  undefined4 *puVar6;
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> **ppWVar7;
  FunctionCodeGenJitTimeData **ppFVar8;
  nullptr_t local_28;
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> local_20;
  ProfileId local_12;
  FunctionCodeGenJitTimeData *pFStack_10;
  ProfileId profiledCallSiteId_local;
  FunctionCodeGenJitTimeData *this_local;
  
  local_12 = profiledCallSiteId;
  pFStack_10 = this;
  pFVar5 = GetFunctionBody(this);
  if (pFVar5 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x53,"(GetFunctionBody())","GetFunctionBody()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  PVar2 = local_12;
  pFVar5 = GetFunctionBody(this);
  PVar4 = FunctionBody::GetProfiledCallSiteCount(pFVar5);
  if (PVar4 <= PVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x54,
                                "(profiledCallSiteId < GetFunctionBody()->GetProfiledCallSiteCount())"
                                ,
                                "profiledCallSiteId < GetFunctionBody()->GetProfiledCallSiteCount()"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ppWVar7 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->inlinees);
  if (*ppWVar7 == (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0) {
    local_28 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::WriteBarrierPtr(&local_20,&local_28);
  }
  else {
    ppWVar7 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)&this->inlinees);
    Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::WriteBarrierPtr
              (&local_20,*ppWVar7 + local_12);
  }
  ppFVar8 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenJitTimeData__
                      ((WriteBarrierPtr *)&local_20);
  return *ppFVar8;
}

Assistant:

const FunctionCodeGenJitTimeData *FunctionCodeGenJitTimeData::GetInlinee(const ProfileId profiledCallSiteId) const
    {
        Assert(GetFunctionBody());
        Assert(profiledCallSiteId < GetFunctionBody()->GetProfiledCallSiteCount());

        return inlinees ? inlinees[profiledCallSiteId] : nullptr;
    }